

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  Rune RVar1;
  int iVar2;
  reference pvVar3;
  int local_3c;
  reference pvStack_38;
  int i_1;
  char *p;
  int i;
  string *bytes_local;
  int nrunes_local;
  Rune *runes_local;
  bool latin1_local;
  
  if (latin1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)nrunes);
    for (p._4_4_ = 0; p._4_4_ < nrunes; p._4_4_ = p._4_4_ + 1) {
      RVar1 = runes[p._4_4_];
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](bytes,(long)p._4_4_);
      *pvVar3 = (value_type)RVar1;
    }
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)(nrunes << 2));
    pvStack_38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](bytes,0);
    for (local_3c = 0; local_3c < nrunes; local_3c = local_3c + 1) {
      iVar2 = runetochar(pvStack_38,runes + local_3c);
      pvStack_38 = pvStack_38 + iVar2;
    }
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](bytes,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)pvStack_38 - (long)pvVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              (bytes);
  }
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}